

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_SubDEdgeSharpness>::Append
          (ON_SimpleArray<ON_SubDEdgeSharpness> *this,ON_SubDEdgeSharpness *x)

{
  int iVar1;
  ON_SubDEdgeSharpness *memblock;
  int iVar2;
  uint uVar3;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if (iVar1 < 8 || (ulong)((long)iVar1 * 8) < 0x10000001) {
      uVar3 = 4;
      if (2 < iVar1) {
        uVar3 = iVar1 * 2;
      }
    }
    else {
      iVar2 = 0x2000008;
      if (iVar1 < 0x2000008) {
        iVar2 = iVar1;
      }
      uVar3 = iVar2 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_SubDEdgeSharpness *)onmalloc(8);
      *(undefined8 *)memblock->m_edge_sharpness = *(undefined8 *)x->m_edge_sharpness;
    }
    if ((uint)this->m_capacity < uVar3) {
      SetCapacity(this,(long)(int)uVar3);
    }
    if (this->m_a == (ON_SubDEdgeSharpness *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  *(undefined8 *)this->m_a[iVar1].m_edge_sharpness = *(undefined8 *)memblock->m_edge_sharpness;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}